

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall llm_tokenizer_bpe::llm_tokenizer_bpe(llm_tokenizer_bpe *this,llama_vocab *vocab)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  llama_vocab_type lVar1;
  llama_vocab_pre_type lVar2;
  llm_tokenizer *in_RDI;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff140;
  iterator in_stack_fffffffffffff148;
  size_type in_stack_fffffffffffff150;
  allocator<char> *in_stack_fffffffffffff160;
  char *in_stack_fffffffffffff168;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *local_e20;
  string *local_dd0;
  string *local_d70;
  string *local_d20;
  string *local_c80;
  string *local_c30;
  string *local_bd0;
  string *local_b80;
  string *local_b30;
  string *local_ae0;
  string *local_a90;
  string *local_a30;
  string *local_9c0;
  string *local_930;
  string *local_8c0;
  string *local_820;
  string *local_7d0;
  undefined1 local_79c [2];
  allocator<char> local_79a;
  allocator<char> local_799;
  string *local_798;
  string local_790 [32];
  undefined1 local_770 [32];
  undefined1 local_750 [32];
  char local_730 [32];
  string *local_710;
  undefined8 local_708;
  undefined1 local_6fa;
  allocator<char> local_6f9;
  string *local_6f8;
  string local_6f0 [32];
  string *local_6d0;
  undefined8 local_6c8;
  undefined1 local_6bb;
  allocator<char> local_6ba;
  allocator<char> local_6b9;
  string *local_6b8;
  string local_6b0 [32];
  undefined1 local_690 [32];
  string *local_670;
  undefined8 local_668;
  undefined1 local_65a;
  allocator<char> local_659;
  string *local_658;
  string local_650 [32];
  string *local_630;
  undefined8 local_628;
  undefined1 local_61f;
  allocator<char> local_61e;
  allocator<char> local_61d;
  allocator<char> local_61c;
  allocator<char> local_61b;
  allocator<char> local_61a;
  allocator<char> local_619;
  string *local_618;
  string local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  undefined1 local_570 [32];
  string *local_550;
  undefined8 local_548;
  undefined1 local_53a;
  allocator<char> local_539;
  string *local_538;
  string local_530 [32];
  string *local_510;
  undefined8 local_508;
  undefined1 local_4fb;
  allocator<char> local_4fa;
  allocator<char> local_4f9;
  string *local_4f8;
  string local_4f0 [32];
  undefined1 local_4d0 [32];
  string *local_4b0;
  undefined8 local_4a8;
  undefined1 local_49a;
  allocator<char> local_499;
  string *local_498;
  string local_490 [32];
  string *local_470;
  undefined8 local_468;
  undefined1 local_45a;
  allocator<char> local_459;
  string *local_458;
  string local_450 [32];
  string *local_430;
  undefined8 local_428;
  undefined1 local_41a;
  allocator<char> local_419;
  string *local_418;
  string local_410 [32];
  string *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3da;
  allocator<char> local_3d9;
  string *local_3d8;
  string local_3d0 [32];
  string *local_3b0;
  undefined8 local_3a8;
  undefined1 local_39b;
  allocator<char> local_39a;
  allocator<char> local_399;
  string *local_398;
  string local_390 [32];
  undefined1 local_370 [32];
  string *local_350;
  undefined8 local_348;
  undefined1 local_33c;
  allocator<char> local_33b;
  allocator<char> local_33a;
  allocator<char> local_339;
  string *local_338;
  string local_330 [32];
  undefined1 local_310 [32];
  undefined1 local_2f0 [32];
  string *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2be;
  allocator<char> local_2bd;
  allocator<char> local_2bc;
  allocator<char> local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  string *local_2b8;
  string local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 local_270 [32];
  undefined1 local_250 [32];
  undefined1 local_230 [32];
  string *local_210;
  undefined8 local_208;
  undefined1 local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  string *local_1f8;
  string local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  string *local_190;
  undefined8 local_188;
  undefined1 local_17f;
  allocator<char> local_17e;
  allocator<char> local_17d;
  allocator<char> local_17c;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  string *local_178;
  string local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  string *local_b0;
  undefined8 local_a8;
  undefined1 local_9a;
  allocator<char> local_99;
  string *local_98;
  string local_90 [32];
  string *local_70;
  undefined8 local_68;
  undefined1 local_5a;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  
  llm_tokenizer::llm_tokenizer(in_RDI);
  in_RDI->_vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_bpe_00644290;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x550b53);
  lVar1 = llama_vocab::get_type((llama_vocab *)0x550b60);
  if (lVar1 == LLAMA_VOCAB_TYPE_BPE) {
    lVar2 = llama_vocab::get_pre_type((llama_vocab *)0x550bae);
    switch(lVar2) {
    case LLAMA_VOCAB_PRE_TYPE_LLAMA3:
      local_5a = 1;
      local_58 = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_5a = 0;
      local_30 = local_50;
      local_28 = 1;
      __l._M_len = in_stack_fffffffffffff150;
      __l._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l);
      local_7d0 = (string *)&local_30;
      do {
        local_7d0 = local_7d0 + -0x20;
        std::__cxx11::string::~string(local_7d0);
      } while (local_7d0 != local_50);
      std::allocator<char>::~allocator(&local_59);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_LLM:
      local_17f = 1;
      local_178 = local_170;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_178 = (string *)local_150;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_178 = (string *)local_130;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_178 = (string *)local_110;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_178 = (string *)local_f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_178 = (string *)local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_17f = 0;
      local_b0 = local_170;
      local_a8 = 6;
      __l_01._M_len = in_stack_fffffffffffff150;
      __l_01._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_01);
      local_8c0 = (string *)&local_b0;
      do {
        local_8c0 = local_8c0 + -0x20;
        std::__cxx11::string::~string(local_8c0);
      } while (local_8c0 != local_170);
      std::allocator<char>::~allocator(&local_17e);
      std::allocator<char>::~allocator(&local_17d);
      std::allocator<char>::~allocator(&local_17c);
      std::allocator<char>::~allocator(&local_17b);
      std::allocator<char>::~allocator(&local_17a);
      std::allocator<char>::~allocator(&local_179);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_CODER:
      local_2be = 1;
      local_2b8 = local_2b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_2b8 = (string *)local_290;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_2b8 = (string *)local_270;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_2b8 = (string *)local_250;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_2b8 = (string *)local_230;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_2be = 0;
      local_210 = local_2b0;
      local_208 = 5;
      __l_03._M_len = in_stack_fffffffffffff150;
      __l_03._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_03);
      local_9c0 = (string *)&local_210;
      do {
        local_9c0 = local_9c0 + -0x20;
        std::__cxx11::string::~string(local_9c0);
      } while (local_9c0 != local_2b0);
      std::allocator<char>::~allocator(&local_2bd);
      std::allocator<char>::~allocator(&local_2bc);
      std::allocator<char>::~allocator(&local_2bb);
      std::allocator<char>::~allocator(&local_2ba);
      std::allocator<char>::~allocator(&local_2b9);
      break;
    case LLAMA_VOCAB_PRE_TYPE_FALCON:
      local_33c = 1;
      local_338 = local_330;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_338 = (string *)local_310;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_338 = (string *)local_2f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_33c = 0;
      local_2d0 = local_330;
      local_2c8 = 3;
      __l_04._M_len = in_stack_fffffffffffff150;
      __l_04._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_04);
      local_a30 = (string *)&local_2d0;
      do {
        local_a30 = local_a30 + -0x20;
        std::__cxx11::string::~string(local_a30);
      } while (local_a30 != local_330);
      std::allocator<char>::~allocator(&local_33b);
      std::allocator<char>::~allocator(&local_33a);
      std::allocator<char>::~allocator(&local_339);
      break;
    case LLAMA_VOCAB_PRE_TYPE_MPT:
    case LLAMA_VOCAB_PRE_TYPE_GPT2:
    case LLAMA_VOCAB_PRE_TYPE_OLMO:
    case LLAMA_VOCAB_PRE_TYPE_JAIS:
    case LLAMA_VOCAB_PRE_TYPE_TRILLION:
      local_3da = 1;
      local_3d8 = local_3d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_3da = 0;
      local_3b0 = local_3d0;
      local_3a8 = 1;
      __l_06._M_len = in_stack_fffffffffffff150;
      __l_06._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_06);
      local_ae0 = (string *)&local_3b0;
      do {
        local_ae0 = local_ae0 + -0x20;
        std::__cxx11::string::~string(local_ae0);
      } while (local_ae0 != local_3d0);
      std::allocator<char>::~allocator(&local_3d9);
      break;
    case LLAMA_VOCAB_PRE_TYPE_STARCODER:
    case LLAMA_VOCAB_PRE_TYPE_REFACT:
    case LLAMA_VOCAB_PRE_TYPE_COMMAND_R:
    case LLAMA_VOCAB_PRE_TYPE_SMOLLM:
    case LLAMA_VOCAB_PRE_TYPE_CODESHELL:
    case LLAMA_VOCAB_PRE_TYPE_EXAONE:
    case LLAMA_VOCAB_PRE_TYPE_MINERVA:
      local_39b = 1;
      local_398 = local_390;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_398 = (string *)local_370;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_39b = 0;
      local_350 = local_390;
      local_348 = 2;
      __l_05._M_len = in_stack_fffffffffffff150;
      __l_05._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_05);
      local_a90 = (string *)&local_350;
      do {
        local_a90 = local_a90 + -0x20;
        std::__cxx11::string::~string(local_a90);
      } while (local_a90 != local_390);
      std::allocator<char>::~allocator(&local_39a);
      std::allocator<char>::~allocator(&local_399);
      break;
    case LLAMA_VOCAB_PRE_TYPE_STABLELM2:
    case LLAMA_VOCAB_PRE_TYPE_QWEN2:
      local_41a = 1;
      local_418 = local_410;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_41a = 0;
      local_3f0 = local_410;
      local_3e8 = 1;
      __l_07._M_len = in_stack_fffffffffffff150;
      __l_07._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_07);
      local_b30 = (string *)&local_3f0;
      do {
        local_b30 = local_b30 + -0x20;
        std::__cxx11::string::~string(local_b30);
      } while (local_b30 != local_410);
      std::allocator<char>::~allocator(&local_419);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DBRX:
    case LLAMA_VOCAB_PRE_TYPE_SMAUG:
      local_9a = 1;
      local_98 = local_90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_9a = 0;
      local_70 = local_90;
      local_68 = 1;
      __l_00._M_len = in_stack_fffffffffffff150;
      __l_00._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_00);
      local_820 = (string *)&local_70;
      do {
        local_820 = local_820 + -0x20;
        std::__cxx11::string::~string(local_820);
      } while (local_820 != local_90);
      std::allocator<char>::~allocator(&local_99);
      break;
    case LLAMA_VOCAB_PRE_TYPE_PORO:
    case LLAMA_VOCAB_PRE_TYPE_BLOOM:
    case LLAMA_VOCAB_PRE_TYPE_GPT3_FINNISH:
      local_45a = 1;
      local_458 = local_450;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_45a = 0;
      local_430 = local_450;
      local_428 = 1;
      __l_08._M_len = in_stack_fffffffffffff150;
      __l_08._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_08);
      local_b80 = (string *)&local_430;
      do {
        local_b80 = local_b80 + -0x20;
        std::__cxx11::string::~string(local_b80);
      } while (local_b80 != local_450);
      std::allocator<char>::~allocator(&local_459);
      break;
    default:
      local_798 = local_790;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_798 = (string *)local_770;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_798 = (string *)local_750;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      __s = local_730;
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79c;
      local_798 = (string *)__s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffff160);
      local_710 = local_790;
      local_708 = 4;
      __l_16._M_len = in_stack_fffffffffffff150;
      __l_16._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_16);
      this_00 = (string *)&local_710;
      do {
        this_00 = this_00 + -0x20;
        std::__cxx11::string::~string(this_00);
      } while (this_00 != local_790);
      std::allocator<char>::~allocator((allocator<char> *)local_79c);
      std::allocator<char>::~allocator((allocator<char> *)(local_79c + 1));
      std::allocator<char>::~allocator(&local_79a);
      std::allocator<char>::~allocator(&local_799);
      break;
    case LLAMA_VOCAB_PRE_TYPE_CHATGLM4:
      local_49a = 1;
      local_498 = local_490;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_49a = 0;
      local_470 = local_490;
      local_468 = 1;
      __l_09._M_len = in_stack_fffffffffffff150;
      __l_09._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_09);
      local_bd0 = (string *)&local_470;
      do {
        local_bd0 = local_bd0 + -0x20;
        std::__cxx11::string::~string(local_bd0);
      } while (local_bd0 != local_490);
      std::allocator<char>::~allocator(&local_499);
      break;
    case LLAMA_VOCAB_PRE_TYPE_VIKING:
      local_4fb = 1;
      local_4f8 = local_4f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_4f8 = (string *)local_4d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_4fb = 0;
      local_4b0 = local_4f0;
      local_4a8 = 2;
      __l_10._M_len = in_stack_fffffffffffff150;
      __l_10._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_10);
      local_c30 = (string *)&local_4b0;
      do {
        local_c30 = local_c30 + -0x20;
        std::__cxx11::string::~string(local_c30);
      } while (local_c30 != local_4f0);
      std::allocator<char>::~allocator(&local_4fa);
      std::allocator<char>::~allocator(&local_4f9);
      break;
    case LLAMA_VOCAB_PRE_TYPE_TEKKEN:
      local_53a = 1;
      local_538 = local_530;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_53a = 0;
      local_510 = local_530;
      local_508 = 1;
      __l_11._M_len = in_stack_fffffffffffff150;
      __l_11._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_11);
      local_c80 = (string *)&local_510;
      do {
        local_c80 = local_c80 + -0x20;
        std::__cxx11::string::~string(local_c80);
      } while (local_c80 != local_530);
      std::allocator<char>::~allocator(&local_539);
      break;
    case LLAMA_VOCAB_PRE_TYPE_CHAMELEON:
      local_61f = 1;
      local_618 = local_610;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_618 = (string *)local_5f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_618 = (string *)local_5d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_618 = (string *)local_5b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_618 = (string *)local_590;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_618 = (string *)local_570;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_61f = 0;
      local_550 = local_610;
      local_548 = 6;
      __l_12._M_len = in_stack_fffffffffffff150;
      __l_12._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_12);
      local_d20 = (string *)&local_550;
      do {
        local_d20 = local_d20 + -0x20;
        std::__cxx11::string::~string(local_d20);
      } while (local_d20 != local_610);
      std::allocator<char>::~allocator(&local_61e);
      std::allocator<char>::~allocator(&local_61d);
      std::allocator<char>::~allocator(&local_61c);
      std::allocator<char>::~allocator(&local_61b);
      std::allocator<char>::~allocator(&local_61a);
      std::allocator<char>::~allocator(&local_619);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK3_LLM:
      local_1fc = 1;
      local_1f8 = local_1f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_1f8 = (string *)local_1d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_1f8 = (string *)local_1b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_1fc = 0;
      local_190 = local_1f0;
      local_188 = 3;
      __l_02._M_len = in_stack_fffffffffffff150;
      __l_02._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_02);
      local_930 = (string *)&local_190;
      do {
        local_930 = local_930 + -0x20;
        std::__cxx11::string::~string(local_930);
      } while (local_930 != local_1f0);
      std::allocator<char>::~allocator(&local_1fb);
      std::allocator<char>::~allocator(&local_1fa);
      std::allocator<char>::~allocator(&local_1f9);
      break;
    case LLAMA_VOCAB_PRE_TYPE_GPT4O:
      local_65a = 1;
      local_658 = local_650;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_65a = 0;
      local_630 = local_650;
      local_628 = 1;
      __l_13._M_len = in_stack_fffffffffffff150;
      __l_13._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_13);
      local_d70 = (string *)&local_630;
      do {
        local_d70 = local_d70 + -0x20;
        std::__cxx11::string::~string(local_d70);
      } while (local_d70 != local_650);
      std::allocator<char>::~allocator(&local_659);
      break;
    case LLAMA_VOCAB_PRE_TYPE_SUPERBPE:
      local_6bb = 1;
      local_6b8 = local_6b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_6b8 = (string *)local_690;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_6bb = 0;
      local_670 = local_6b0;
      local_668 = 2;
      __l_14._M_len = in_stack_fffffffffffff150;
      __l_14._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_14);
      local_dd0 = (string *)&local_670;
      do {
        local_dd0 = local_dd0 + -0x20;
        std::__cxx11::string::~string(local_dd0);
      } while (local_dd0 != local_6b0);
      std::allocator<char>::~allocator(&local_6ba);
      std::allocator<char>::~allocator(&local_6b9);
      break;
    case LLAMA_VOCAB_PRE_TYPE_BAILINGMOE:
      local_6fa = 1;
      local_6f8 = local_6f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160);
      local_6fa = 0;
      local_6d0 = local_6f0;
      local_6c8 = 1;
      __l_15._M_len = in_stack_fffffffffffff150;
      __l_15._M_array = in_stack_fffffffffffff148;
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffff140,__l_15);
      local_e20 = (string *)&local_6d0;
      do {
        local_e20 = local_e20 + -0x20;
        std::__cxx11::string::~string(local_e20);
      } while (local_e20 != local_6f0);
      std::allocator<char>::~allocator(&local_6f9);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
             ,0x116,"GGML_ASSERT(%s) failed","vocab.get_type() == LLAMA_VOCAB_TYPE_BPE");
}

Assistant:

llm_tokenizer_bpe(const llama_vocab & vocab) {
        GGML_ASSERT(vocab.get_type() == LLAMA_VOCAB_TYPE_BPE);
        switch (vocab.get_pre_type()) {
            case LLAMA_VOCAB_PRE_TYPE_LLAMA3:
                regex_exprs = {
                    // original regex from tokenizer.json
                    //"(?i:'s|'t|'re|'ve|'m|'ll|'d)|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",

                    // adapted: https://github.com/ggerganov/llama.cpp/pull/6920#issuecomment-2080233989
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DBRX:
            case LLAMA_VOCAB_PRE_TYPE_SMAUG:
                regex_exprs = {
                    // same as llama3
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_LLM:
                regex_exprs = {
                    "[\r\n]",
                    "\\s?[A-Za-zµÀ-ÖØ-öø-ƺƼ-ƿǄ-ʓʕ-ʯͰ-ͳͶͷͻ-ͽͿΆΈ-ΊΌΎ-ΡΣ-ϵϷ-ҁҊ-ԯԱ-ՖႠ-ჅᎠ-Ᏽᏸ-ᏽᲐ-ᲺᲽ-Ჿᴀ-ᴫᵫ-ᵷᵹ-ᶚḀ-ἕἘ-Ἕἠ-ὅὈ-Ὅὐ-ὗὙὛὝὟ-ώᾀ-ᾴᾶ-ᾼιῂ-ῄῆ-ῌῐ-ΐῖ-Ίῠ-Ῥῲ-ῴῶ-ῼℂℇℊ-ℓℕℙ-ℝℤΩℨK-ℭℯ-ℴℹℼ-ℿⅅ-ⅉⅎↃↄⰀ-ⱻⱾ-ⳤⳫ-ⳮⳲⳳꙀ-ꙭꚀ-ꚛꜢ-ꝯꝱ-ꞇꞋ-ꞎꭰ-ꮿﬀ-ﬆﬓ-ﬗＡ-Ｚａ-ｚ𐐀-𐑏𐒰-𐓓𐓘-𐓻𐲀-𐲲𐳀-𐳲𑢠-𑣟𞤀-𞥃]+",
                    "\\s?[!-/:-~！-／：-～‘-‟　-。]+",
                    "\\s+$",
                    "[一-龥ࠀ-一가-퟿]+",
                    "\\p{N}+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK3_LLM:
                regex_exprs = {
                    "\\p{N}{1,3}",
                    "[一-龥぀-ゟ゠-ヿ]+",
                    "[!\"#$%&'()*+,\\-./:;<=>?@\\[\\\\\\]^_`{|}~][A-Za-z]+|[^\r\n\\p{L}\\p{P}\\p{S}]?[\\p{L}\\p{M}]+| ?[\\p{P}\\p{S}]+[\r\n]*|\\s*[\r\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_CODER:
                regex_exprs = {
                    "[\r\n]",
                    "\\s?\\p{L}+",
                    "\\s?\\p{P}+",
                    "[一-龥ࠀ-一가-퟿]+",
                    "\\p{N}",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_FALCON:
                regex_exprs = {
                    "[\\p{P}\\$\\+<=>\\^~\\|`]+",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                    "[0-9][0-9][0-9]",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_STARCODER:
            case LLAMA_VOCAB_PRE_TYPE_REFACT:
            case LLAMA_VOCAB_PRE_TYPE_COMMAND_R:
            case LLAMA_VOCAB_PRE_TYPE_SMOLLM:
            case LLAMA_VOCAB_PRE_TYPE_CODESHELL:
            case LLAMA_VOCAB_PRE_TYPE_EXAONE:
            case LLAMA_VOCAB_PRE_TYPE_MINERVA:
                regex_exprs = {
                    "\\p{N}",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_GPT2:
            case LLAMA_VOCAB_PRE_TYPE_MPT:
            case LLAMA_VOCAB_PRE_TYPE_OLMO:
            case LLAMA_VOCAB_PRE_TYPE_JAIS:
            case LLAMA_VOCAB_PRE_TYPE_TRILLION:
                regex_exprs = {
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_STABLELM2:
            case LLAMA_VOCAB_PRE_TYPE_QWEN2:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "(?i:'s|'t|'re|'ve|'m|'ll|'d)|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_PORO:
            case LLAMA_VOCAB_PRE_TYPE_BLOOM:
            case LLAMA_VOCAB_PRE_TYPE_GPT3_FINNISH:
                regex_exprs = {
                    " ?[^(\\s|.,!?…。，、।۔،)]+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_CHATGLM4:
                regex_exprs = {
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_VIKING:
                regex_exprs = {
                    " ?[^(\\s|.,!?…。，、।۔،)]+",
                    "\\p{N}",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_TEKKEN:
                // original regex from tokenizer.json
                // "[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]*[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]+|[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]+[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]*|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                regex_exprs = {
                    "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_CHAMELEON:
                // Note: in theory, the special token (sentinel and image token) regex_exprs below
                // are unnecessary, as they are split in `tokenizer_st_partition` anyway.
                // However, since the upstream pre-tokenizer uses them, they are also
                // included here (see https://huggingface.co/facebook/chameleon-7b).
                regex_exprs = {
                    "<sentinel:[0-9]+>",  // Sentinel tokens
                    "(IMGIMG)((A|B|C|D|E|F|G|H|I){1,4})Z",  // Image tokens
                    "([\\t\\n]|    |  )",  // directly from tokenizer.json
                    "\\p{N}", // Individual digits
                    "[\\p{P}!-/:-@\\[-`{-~]",  // Punctuation, Isolated
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_GPT4O:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]*[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]+(?i:'s|'t|'re|'ve|'m|'ll|'d)?|[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]+[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]*(?i:'s|'t|'re|'ve|'m|'ll|'d)?|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                    "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])?|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])?|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_SUPERBPE:
                regex_exprs = {
                    "\\p{N}+",
                    "(?=(\\d{3})+(?!\\d))",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_BAILINGMOE:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "'(?i:[sdmt]|ll|ve|re)|[^\\r\\n\\p{L}\\p{N}]?+\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]++[\\r\\n]*|\\s*[\\r\\n]|\\s+(?!\\S)|\\s+"
                    // FIXME? Changed possessive quantifiers (?+ and ++) to greedy to avoid errors and imatrix hanging (tried atomic grouping but it's not supported?)
                    "'(?:[sSdDmMtT]|[lL][lL]|[vV][eE]|[rR][eE])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]|\\s+(?!\\S)|\\s+",
                };
                break;
            default:
                // default regex for BPE tokenization pre-processing
                regex_exprs = {
                    "[\\p{P}\\$\\+<=>\\^~\\|]+",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                    "\\p{N}+",
                    "[0-9][0-9][0-9]",
                };
                break;
        }
    }